

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O3

int sndio_stream_init(cubeb_conflict2 *context,cubeb_stream_conflict2 **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency_frames,cubeb_data_callback_conflict2 data_callback,
                     cubeb_state_callback_conflict2 state_callback,void *user_ptr)

{
  cubeb_sample_format cVar1;
  uint32_t uVar2;
  uint uVar3;
  _func_sio_hdl_ptr_char_ptr_uint_int *p_Var4;
  int iVar5;
  cubeb_stream_conflict2 *__ptr;
  cubeb_stream_params *pcVar6;
  char *pcVar7;
  sio_hdl *psVar8;
  uchar *puVar9;
  char *pcVar10;
  ulong uVar11;
  sio_par wpar;
  uint local_cc;
  sio_par local_b0;
  sio_par local_70;
  
  __ptr = (cubeb_stream_conflict2 *)calloc(1,0xa8);
  if (__ptr == (cubeb_stream_conflict2 *)0x0) {
    return -1;
  }
  if (input_stream_params == (cubeb_stream_params *)0x0) {
    local_cc = 1;
    if (output_stream_params == (cubeb_stream_params *)0x0) goto LAB_0011e2d5;
LAB_0011e04a:
    if ((output_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) != CUBEB_STREAM_PREF_NONE)
    goto LAB_0011e2d5;
    __ptr->mode = local_cc;
    pcVar6 = output_stream_params;
  }
  else {
    if ((input_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) != CUBEB_STREAM_PREF_NONE)
    goto LAB_0011e2d5;
    __ptr->mode = 2;
    local_cc = 3;
    if (output_stream_params != (cubeb_stream_params *)0x0) goto LAB_0011e04a;
    local_cc = 2;
    pcVar6 = input_stream_params;
  }
  cVar1 = pcVar6->format;
  uVar2 = pcVar6->rate;
  __ptr->context = context;
  p_Var4 = cubeb_sio_open;
  pcVar7 = getenv("AUDIODEVICE");
  if (pcVar7 == (char *)0x0) {
    pcVar10 = "snd/0";
  }
  else {
    pcVar10 = "snd/0";
    if (*pcVar7 != '\0') {
      pcVar10 = pcVar7;
    }
  }
  psVar8 = (*p_Var4)(pcVar10,local_cc,1);
  __ptr->hdl = psVar8;
  if (psVar8 != (sio_hdl *)0x0) {
    (*cubeb_sio_initpar)(&local_70);
    local_70.sig = 1;
    local_70.bits = 0x10;
    if (cVar1 < CUBEB_SAMPLE_FLOAT32BE) {
      local_70.le = *(uint *)(&DAT_001373cc + (ulong)cVar1 * 4);
      if ((local_cc & 2) != 0) {
        local_70.rchan = input_stream_params->channels;
      }
      if ((local_cc & 1) != 0) {
        local_70.pchan = output_stream_params->channels;
      }
      local_70.appbufsz = latency_frames;
      local_70.rate = uVar2;
      iVar5 = (*cubeb_sio_setpar)(psVar8,&local_70);
      if ((((((iVar5 != 0) && (iVar5 = (*cubeb_sio_getpar)(psVar8,&local_b0), iVar5 != 0)) &&
            (local_b0.bits == local_70.bits)) &&
           ((local_b0.le == local_70.le && (local_b0.sig == local_70.sig)))) &&
          ((local_b0.rate == local_70.rate &&
           (((local_cc & 2) == 0 || (local_b0.rchan == local_70.rchan)))))) &&
         (((local_cc & 1) == 0 || (local_b0.pchan == local_70.pchan)))) {
        (*cubeb_sio_onmove)(psVar8,sndio_onmove,__ptr);
        __ptr->active = 0;
        __ptr->nfr = local_b0.round;
        __ptr->rbpf = local_b0.rchan * local_b0.bps;
        __ptr->pbpf = local_b0.pchan * local_b0.bps;
        __ptr->rchan = local_b0.rchan;
        __ptr->pchan = local_b0.pchan;
        __ptr->nblks = local_b0.bufsz / local_b0.round;
        __ptr->data_cb = data_callback;
        __ptr->state_cb = state_callback;
        __ptr->arg = user_ptr;
        __ptr->hwpos = 0;
        __ptr->swpos = 0;
        (__ptr->mtx).__align = 0;
        *(undefined8 *)((long)&__ptr->mtx + 8) = 0;
        *(undefined8 *)((long)&__ptr->mtx + 0x10) = 0;
        (__ptr->mtx).__data.__list.__prev = (__pthread_internal_list *)0x0;
        uVar11 = 4;
        if (cVar1 != CUBEB_SAMPLE_FLOAT32LE) {
          uVar11 = (ulong)local_b0.bps;
        }
        (__ptr->mtx).__data.__list.__next = (__pthread_internal_list *)0x0;
        __ptr->conv = (uint)((ulong)cVar1 == 2);
        uVar3 = __ptr->mode;
        if ((uVar3 & 1) != 0) {
          puVar9 = (uchar *)malloc((ulong)local_b0.pchan * (ulong)local_b0.round * uVar11);
          __ptr->pbuf = puVar9;
          if (puVar9 == (uchar *)0x0) goto LAB_0011e2d5;
        }
        if ((uVar3 & 2) != 0) {
          puVar9 = (uchar *)malloc((ulong)local_b0.rchan * (ulong)local_b0.round * uVar11);
          __ptr->rbuf = puVar9;
          if (puVar9 == (uchar *)0x0) goto LAB_0011e2d5;
        }
        __ptr->volume = 1.0;
        *stream = __ptr;
        return 0;
      }
    }
  }
LAB_0011e2d5:
  if (__ptr->hdl != (sio_hdl *)0x0) {
    (*cubeb_sio_close)(__ptr->hdl);
  }
  if (__ptr->pbuf != (uchar *)0x0) {
    free(__ptr->pbuf);
  }
  if (__ptr->rbuf != (uchar *)0x0) {
    free(__ptr->pbuf);
  }
  free(__ptr);
  return -1;
}

Assistant:

static int
sndio_stream_init(cubeb * context,
                  cubeb_stream ** stream,
                  char const * stream_name,
                  cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency_frames,
                  cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback,
                  void *user_ptr)
{
  cubeb_stream *s;
  struct sio_par wpar, rpar;
  cubeb_sample_format format;
  int rate;
  size_t bps;

  DPR("sndio_stream_init(%s)\n", stream_name);

  s = malloc(sizeof(cubeb_stream));
  if (s == NULL)
    return CUBEB_ERROR;
  memset(s, 0, sizeof(cubeb_stream));
  s->mode = 0;
  if (input_stream_params) {
    if (input_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_REC;
    format = input_stream_params->format;
    rate = input_stream_params->rate;
  }
  if (output_stream_params) {
    if (output_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_PLAY;
    format = output_stream_params->format;
    rate = output_stream_params->rate;
  }
  if (s->mode == 0) {
    DPR("sndio_stream_init(), neither playing nor recording\n");
    goto err;
  }
  s->context = context;
  s->hdl = WRAP(sio_open)(sndio_get_device(), s->mode, 1);
  if (s->hdl == NULL) {
    DPR("sndio_stream_init(), sio_open() failed\n");
    goto err;
  }
  WRAP(sio_initpar)(&wpar);
  wpar.sig = 1;
  wpar.bits = 16;
  switch (format) {
  case CUBEB_SAMPLE_S16LE:
    wpar.le = 1;
    break;
  case CUBEB_SAMPLE_S16BE:
    wpar.le = 0;
    break;
  case CUBEB_SAMPLE_FLOAT32NE:
    wpar.le = SIO_LE_NATIVE;
    break;
  default:
    DPR("sndio_stream_init() unsupported format\n");
    goto err;
  }
  wpar.rate = rate;
  if (s->mode & SIO_REC)
    wpar.rchan = input_stream_params->channels;
  if (s->mode & SIO_PLAY)
    wpar.pchan = output_stream_params->channels;
  wpar.appbufsz = latency_frames;
  if (!WRAP(sio_setpar)(s->hdl, &wpar) || !WRAP(sio_getpar)(s->hdl, &rpar)) {
    DPR("sndio_stream_init(), sio_setpar() failed\n");
    goto err;
  }
  if (rpar.bits != wpar.bits || rpar.le != wpar.le ||
      rpar.sig != wpar.sig || rpar.rate != wpar.rate ||
      ((s->mode & SIO_REC) && rpar.rchan != wpar.rchan) ||
      ((s->mode & SIO_PLAY) && rpar.pchan != wpar.pchan)) {
    DPR("sndio_stream_init() unsupported params\n");
    goto err;
  }
  WRAP(sio_onmove)(s->hdl, sndio_onmove, s);
  s->active = 0;
  s->nfr = rpar.round;
  s->rbpf = rpar.bps * rpar.rchan;
  s->pbpf = rpar.bps * rpar.pchan;
  s->rchan = rpar.rchan;
  s->pchan = rpar.pchan;
  s->nblks = rpar.bufsz / rpar.round;
  s->data_cb = data_callback;
  s->state_cb = state_callback;
  s->arg = user_ptr;
  s->mtx = (pthread_mutex_t)PTHREAD_MUTEX_INITIALIZER;
  s->hwpos = s->swpos = 0;
  if (format == CUBEB_SAMPLE_FLOAT32LE) {
    s->conv = 1;
    bps = sizeof(float);
  } else {
    s->conv = 0;
    bps = rpar.bps;
  }
  if (s->mode & SIO_PLAY) {
    s->pbuf = malloc(bps * rpar.pchan * rpar.round);
    if (s->pbuf == NULL)
      goto err;
  }
  if (s->mode & SIO_REC) {
    s->rbuf = malloc(bps * rpar.rchan * rpar.round);
    if (s->rbuf == NULL)
      goto err;
  }
  s->volume = 1.;
  *stream = s;
  DPR("sndio_stream_init() end, ok\n");
  (void)context;
  (void)stream_name;
  return CUBEB_OK;
err:
  if (s->hdl)
    WRAP(sio_close)(s->hdl);
  if (s->pbuf)
    free(s->pbuf);
  if (s->rbuf)
    free(s->pbuf);
  free(s);
  return CUBEB_ERROR;
}